

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

DWORD ConvertBytesToInteger_4(LPBYTE ValueAsBytes)

{
  DWORD Value;
  LPBYTE ValueAsBytes_local;
  
  return CONCAT31(CONCAT21(CONCAT11(*ValueAsBytes,ValueAsBytes[1]),ValueAsBytes[2]),ValueAsBytes[3])
  ;
}

Assistant:

DWORD ConvertBytesToInteger_4(LPBYTE ValueAsBytes)
{
    DWORD Value = 0;

    Value = (Value << 0x08) | ValueAsBytes[0];
    Value = (Value << 0x08) | ValueAsBytes[1];
    Value = (Value << 0x08) | ValueAsBytes[2];
    Value = (Value << 0x08) | ValueAsBytes[3];

    return Value;
}